

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O3

int CBB_flush_asn1_set_of(CBB *cbb)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  size_t size;
  CBS *__base;
  uint8_t *puVar4;
  size_t sVar5;
  ulong num;
  ulong uVar6;
  CBS *out;
  size_t *psVar7;
  size_t sVar8;
  CBS cbs;
  CBS local_40;
  
  iVar1 = CBB_flush(cbb);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    puVar3 = CBB_data(cbb);
    local_40.len = CBB_len(cbb);
    iVar1 = 1;
    if (local_40.len != 0) {
      num = 0;
      local_40.data = puVar3;
      do {
        iVar2 = CBS_get_any_asn1_element(&local_40,(CBS *)0x0,(CBS_ASN1_TAG *)0x0,(size_t *)0x0);
        if (iVar2 == 0) {
          ERR_put_error(0xe,0,0x42,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                        ,0x297);
          return 0;
        }
        num = num + 1;
      } while (local_40.len != 0);
      if (1 < num) {
        size = CBB_len(cbb);
        puVar3 = CBB_data(cbb);
        puVar3 = (uint8_t *)OPENSSL_memdup(puVar3,size);
        __base = (CBS *)OPENSSL_calloc(num,0x10);
        iVar1 = 0;
        if (__base != (CBS *)0x0 && puVar3 != (uint8_t *)0x0) {
          uVar6 = num;
          out = __base;
          local_40.data = puVar3;
          local_40.len = size;
          do {
            iVar1 = 0;
            iVar2 = CBS_get_any_asn1_element(&local_40,out,(CBS_ASN1_TAG *)0x0,(size_t *)0x0);
            if (iVar2 == 0) goto LAB_001bdb52;
            out = out + 1;
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
          qsort(__base,num,0x10,compare_set_of_element);
          puVar4 = CBB_data(cbb);
          psVar7 = &__base->len;
          sVar8 = 0;
          do {
            if (*psVar7 == 0) {
              sVar5 = 0;
            }
            else {
              memcpy(puVar4 + sVar8,((CBS *)(psVar7 + -1))->data,*psVar7);
              sVar5 = *psVar7;
            }
            sVar8 = sVar8 + sVar5;
            psVar7 = psVar7 + 2;
            num = num - 1;
          } while (num != 0);
          iVar1 = 1;
          if (sVar8 != size) {
            __assert_fail("offset == buf_len",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                          ,700,"int CBB_flush_asn1_set_of(CBB *)");
          }
        }
LAB_001bdb52:
        OPENSSL_free(puVar3);
        OPENSSL_free(__base);
      }
    }
  }
  return iVar1;
}

Assistant:

int CBB_flush_asn1_set_of(CBB *cbb) {
  if (!CBB_flush(cbb)) {
    return 0;
  }

  CBS cbs;
  size_t num_children = 0;
  CBS_init(&cbs, CBB_data(cbb), CBB_len(cbb));
  while (CBS_len(&cbs) != 0) {
    if (!CBS_get_any_asn1_element(&cbs, NULL, NULL, NULL)) {
      OPENSSL_PUT_ERROR(CRYPTO, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
      return 0;
    }
    num_children++;
  }

  if (num_children < 2) {
    return 1;  // Nothing to do. This is the common case for X.509.
  }

  // Parse out the children and sort. We alias them into a copy of so they
  // remain valid as we rewrite |cbb|.
  int ret = 0;
  size_t buf_len = CBB_len(cbb);
  uint8_t *buf =
      reinterpret_cast<uint8_t *>(OPENSSL_memdup(CBB_data(cbb), buf_len));
  CBS *children =
      reinterpret_cast<CBS *>(OPENSSL_calloc(num_children, sizeof(CBS)));
  uint8_t *out;
  size_t offset = 0;
  if (buf == NULL || children == NULL) {
    goto err;
  }
  CBS_init(&cbs, buf, buf_len);
  for (size_t i = 0; i < num_children; i++) {
    if (!CBS_get_any_asn1_element(&cbs, &children[i], NULL, NULL)) {
      goto err;
    }
  }
  qsort(children, num_children, sizeof(CBS), compare_set_of_element);

  // Write the contents back in the new order.
  out = (uint8_t *)CBB_data(cbb);
  for (size_t i = 0; i < num_children; i++) {
    OPENSSL_memcpy(out + offset, CBS_data(&children[i]), CBS_len(&children[i]));
    offset += CBS_len(&children[i]);
  }
  assert(offset == buf_len);

  ret = 1;

err:
  OPENSSL_free(buf);
  OPENSSL_free(children);
  return ret;
}